

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O0

DatabaseName * DatabaseName::parse(path *db_base,string *name)

{
  runtime_error *this;
  string *in_RDX;
  path *in_RSI;
  DatabaseName *in_RDI;
  string id;
  string type;
  size_type second_dot;
  size_type first_dot;
  path *in_stack_fffffffffffffec8;
  string local_118 [32];
  string local_f8 [8];
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  path *in_stack_ffffffffffffff28;
  DatabaseName *in_stack_ffffffffffffff30;
  string local_78 [32];
  string local_58 [48];
  long local_28;
  undefined8 local_20;
  string *local_18;
  
  local_18 = in_RDX;
  local_20 = std::__cxx11::string::find((char)in_RDX,0x2e);
  local_28 = std::__cxx11::string::find((char)local_18,0x2e);
  if (local_28 == -1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Invalid dataset ID found");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)local_18);
  std::__cxx11::string::substr((ulong)local_78,(ulong)local_18);
  std::experimental::filesystem::v1::__cxx11::path::path(in_RSI,in_stack_fffffffffffffec8);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff28,local_58);
  std::__cxx11::string::string(local_f8,local_78);
  std::__cxx11::string::string(local_118,local_18);
  DatabaseName(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_RSI);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return in_RDI;
}

Assistant:

DatabaseName DatabaseName::parse(fs::path db_base, const std::string &name) {
    auto first_dot = name.find('.');
    auto second_dot = name.find('.', first_dot + 1);
    if (second_dot == std::string::npos) {
        throw std::runtime_error("Invalid dataset ID found");
    }
    std::string type = name.substr(0, first_dot);
    std::string id = name.substr(first_dot + 1, second_dot - first_dot - 1);
    return DatabaseName(std::move(db_base), type, id, name);
}